

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O0

void free_obj_index(OBJ_INDEX_DATA *pObj)

{
  OBJ_INDEX_DATA *in_RDI;
  AFFECT_DATA *pAf;
  EXTRA_DESCR_DATA *pExtra;
  AFFECT_DATA *local_18;
  char *in_stack_fffffffffffffff0;
  EXTRA_DESCR_DATA *pEVar1;
  
  free_pstring(in_stack_fffffffffffffff0);
  free_pstring(in_stack_fffffffffffffff0);
  free_pstring(in_stack_fffffffffffffff0);
  for (local_18 = in_RDI->affected; local_18 != (AFFECT_DATA *)0x0; local_18 = local_18->next) {
    free_affect((AFFECT_DATA *)0x7924a0);
  }
  for (pEVar1 = in_RDI->extra_descr; pEVar1 != (EXTRA_DESCR_DATA *)0x0; pEVar1 = pEVar1->next) {
    free_extra_descr((EXTRA_DESCR_DATA *)0x7924cd);
  }
  in_RDI->next = obj_index_free;
  obj_index_free = in_RDI;
  return;
}

Assistant:

void free_obj_index(OBJ_INDEX_DATA *pObj)
{
	EXTRA_DESCR_DATA *pExtra;
	AFFECT_DATA *pAf;

	free_pstring(pObj->name);
	free_pstring(pObj->short_descr);
	free_pstring(pObj->description);

	for (pAf = pObj->affected; pAf; pAf = pAf->next)
	{
		free_affect(pAf);
	}

	for (pExtra = pObj->extra_descr; pExtra; pExtra = pExtra->next)
	{
		free_extra_descr(pExtra);
	}

	pObj->next = obj_index_free;
	obj_index_free = pObj;
}